

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::PropertyEnumStepEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  PropertyEnumStepEventLogEntry *pPVar1;
  PropertyEnumStepEventLogEntry *propertyEvt;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntry *evt_local;
  
  pPVar1 = GetInlineEventDataAs<TTD::NSLogEvents::PropertyEnumStepEventLogEntry,(TTD::NSLogEvents::EventKind)8>
                     (evt);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(pPVar1->ReturnCode != 0),1);
  FileWriter::WriteUInt32(writer,propertyId,pPVar1->Pid,CommaSeparator);
  FileWriter::WriteUInt32(writer,attributeFlags,(uint)pPVar1->Attributes,CommaSeparator);
  if (pPVar1->ReturnCode != 0) {
    FileWriter::WriteString(writer,stringVal,&pPVar1->PropertyString,CommaSeparator);
  }
  return;
}

Assistant:

void PropertyEnumStepEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const PropertyEnumStepEventLogEntry* propertyEvt = GetInlineEventDataAs<PropertyEnumStepEventLogEntry, EventKind::PropertyEnumTag>(evt);

            writer->WriteBool(NSTokens::Key::boolVal, !!propertyEvt->ReturnCode, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::propertyId, propertyEvt->Pid, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::attributeFlags, propertyEvt->Attributes, NSTokens::Separator::CommaSeparator);

            if(propertyEvt->ReturnCode)
            {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                writer->WriteString(NSTokens::Key::stringVal, propertyEvt->PropertyString, NSTokens::Separator::CommaSeparator);
#else
                if(propertyEvt->Pid == Js::Constants::NoProperty)
                {
                    writer->WriteString(NSTokens::Key::stringVal, propertyEvt->PropertyString, NSTokens::Separator::CommaSeparator);
                }
#endif
            }
        }